

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

size_t dw2ascii(uint8_t *string,size_t bufsize)

{
  size_t alphalen;
  size_t i;
  size_t bufsize_local;
  uint8_t *string_local;
  
  for (alphalen = 0; alphalen < bufsize; alphalen = alphalen + 1) {
    if (string[alphalen] < 0x61) {
      string[alphalen] =
           "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ[]\'*>_:=_.,-_?!;)(``/\'___________ \n"
           [string[alphalen]];
    }
    else {
      string[alphalen] = ' ';
    }
  }
  return bufsize;
}

Assistant:

size_t dw2ascii(uint8_t *string, size_t bufsize)
{
    size_t i, alphalen;

    alphalen = strlen(alphabet);
    for (i=0; i < bufsize; i++) {
        if (string[i] < alphalen) {
            string[i] = alphabet[string[i]];
        } else {
            string[i] = ' ';
        }
    }
    return bufsize;
}